

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_fma::forward_inplace(TanH_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var [60];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar50 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar3 * uVar11 * sVar2 + (long)pvVar1);
    lVar9 = 0;
    for (iVar8 = 0; auVar49 = auVar50._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar38._8_4_ = 0xc0000000;
      auVar38._0_8_ = 0xc0000000c0000000;
      auVar38._12_4_ = 0xc0000000;
      auVar38._16_4_ = 0xc0000000;
      auVar38._20_4_ = 0xc0000000;
      auVar38._24_4_ = 0xc0000000;
      auVar38._28_4_ = 0xc0000000;
      auVar17._0_4_ = *(float *)*pauVar6 * -2.0;
      auVar17._4_4_ = *(float *)((long)*pauVar6 + 4) * -2.0;
      auVar17._8_4_ = *(float *)((long)*pauVar6 + 8) * -2.0;
      auVar17._12_4_ = *(float *)((long)*pauVar6 + 0xc) * -2.0;
      auVar17._16_4_ = *(float *)((long)*pauVar6 + 0x10) * -2.0;
      auVar17._20_4_ = *(float *)((long)*pauVar6 + 0x14) * -2.0;
      auVar17._28_36_ = in_ZMM0._28_36_;
      auVar17._24_4_ = *(float *)((long)*pauVar6 + 0x18) * -2.0;
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar23._16_4_ = 0x42b0c0a5;
      auVar23._20_4_ = 0x42b0c0a5;
      auVar23._24_4_ = 0x42b0c0a5;
      auVar23._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar17._0_32_,auVar23);
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar24._16_4_ = 0xc2b0c0a5;
      auVar24._20_4_ = 0xc2b0c0a5;
      auVar24._24_4_ = 0xc2b0c0a5;
      auVar24._28_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar16,auVar24);
      auVar25._8_4_ = 0x3fb8aa3b;
      auVar25._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar25._12_4_ = 0x3fb8aa3b;
      auVar25._16_4_ = 0x3fb8aa3b;
      auVar25._20_4_ = 0x3fb8aa3b;
      auVar25._24_4_ = 0x3fb8aa3b;
      auVar25._28_4_ = 0x3fb8aa3b;
      auVar43._8_4_ = 0x3f000000;
      auVar43._0_8_ = 0x3f0000003f000000;
      auVar43._12_4_ = 0x3f000000;
      auVar43._16_4_ = 0x3f000000;
      auVar43._20_4_ = 0x3f000000;
      auVar43._24_4_ = 0x3f000000;
      auVar43._28_4_ = 0x3f000000;
      auVar12 = vfmadd213ps_fma(auVar25,auVar4,auVar43);
      auVar15 = vroundps_avx(ZEXT1632(auVar12),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar12),auVar15,1);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar16 = vandps_avx(auVar16,auVar44);
      auVar16 = vsubps_avx(auVar15,auVar16);
      auVar32._8_4_ = 0x3f318000;
      auVar32._0_8_ = 0x3f3180003f318000;
      auVar32._12_4_ = 0x3f318000;
      auVar32._16_4_ = 0x3f318000;
      auVar32._20_4_ = 0x3f318000;
      auVar32._24_4_ = 0x3f318000;
      auVar32._28_4_ = 0x3f318000;
      auVar12 = vfmsub231ps_fma(auVar4,auVar16,auVar32);
      auVar33._8_4_ = 0x395e8083;
      auVar33._0_8_ = 0x395e8083395e8083;
      auVar33._12_4_ = 0x395e8083;
      auVar33._16_4_ = 0x395e8083;
      auVar33._20_4_ = 0x395e8083;
      auVar33._24_4_ = 0x395e8083;
      auVar33._28_4_ = 0x395e8083;
      auVar13 = vfmsub231ps_fma(ZEXT1632(auVar12),auVar16,auVar33);
      auVar15 = ZEXT1632(auVar13);
      auVar4._28_4_ = 0x395e8083;
      auVar4._0_28_ =
           ZEXT1628(CONCAT412(auVar13._12_4_ * auVar13._12_4_,
                              CONCAT48(auVar13._8_4_ * auVar13._8_4_,
                                       CONCAT44(auVar13._4_4_ * auVar13._4_4_,
                                                auVar13._0_4_ * auVar13._0_4_))));
      auVar36._8_4_ = 0x39506967;
      auVar36._0_8_ = 0x3950696739506967;
      auVar36._12_4_ = 0x39506967;
      auVar36._16_4_ = 0x39506967;
      auVar36._20_4_ = 0x39506967;
      auVar36._24_4_ = 0x39506967;
      auVar36._28_4_ = 0x39506967;
      auVar45._8_4_ = 0x3ab743ce;
      auVar45._0_8_ = 0x3ab743ce3ab743ce;
      auVar45._12_4_ = 0x3ab743ce;
      auVar45._16_4_ = 0x3ab743ce;
      auVar45._20_4_ = 0x3ab743ce;
      auVar45._24_4_ = 0x3ab743ce;
      auVar45._28_4_ = 0x3ab743ce;
      auVar12 = vfmadd213ps_fma(auVar36,auVar15,auVar45);
      auVar46._8_4_ = 0x3c088908;
      auVar46._0_8_ = 0x3c0889083c088908;
      auVar46._12_4_ = 0x3c088908;
      auVar46._16_4_ = 0x3c088908;
      auVar46._20_4_ = 0x3c088908;
      auVar46._24_4_ = 0x3c088908;
      auVar46._28_4_ = 0x3c088908;
      auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar15,auVar46);
      auVar47._8_4_ = 0x3d2aa9c1;
      auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._12_4_ = 0x3d2aa9c1;
      auVar47._16_4_ = 0x3d2aa9c1;
      auVar47._20_4_ = 0x3d2aa9c1;
      auVar47._24_4_ = 0x3d2aa9c1;
      auVar47._28_4_ = 0x3d2aa9c1;
      auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar15,auVar47);
      auVar48._8_4_ = 0x3e2aaaaa;
      auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._12_4_ = 0x3e2aaaaa;
      auVar48._16_4_ = 0x3e2aaaaa;
      auVar48._20_4_ = 0x3e2aaaaa;
      auVar48._24_4_ = 0x3e2aaaaa;
      auVar48._28_4_ = 0x3e2aaaaa;
      auVar15 = ZEXT1632(auVar13);
      auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar15,auVar48);
      auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar15,auVar43);
      auVar13 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar4,auVar15);
      auVar12._0_4_ = (int)auVar16._0_4_;
      auVar12._4_4_ = (int)auVar16._4_4_;
      auVar12._8_4_ = (int)auVar16._8_4_;
      auVar12._12_4_ = (int)auVar16._12_4_;
      auVar15._16_4_ = (int)auVar16._16_4_;
      auVar15._0_16_ = auVar12;
      auVar15._20_4_ = (int)auVar16._20_4_;
      auVar15._24_4_ = (int)auVar16._24_4_;
      auVar15._28_4_ = (int)auVar16._28_4_;
      auVar18 = vpslld_avx(auVar12,0x17);
      auVar12 = vpslld_avx(auVar15._16_16_,0x17);
      auVar12 = vpaddd_avx(auVar49,auVar12);
      auVar49 = vpaddd_avx(auVar49,auVar18);
      auVar16._16_16_ = auVar12;
      auVar16._0_16_ = auVar49;
      auVar26._0_4_ = auVar13._0_4_ + 1.0;
      auVar26._4_4_ = auVar13._4_4_ + 1.0;
      auVar26._8_4_ = auVar13._8_4_ + 1.0;
      auVar26._12_4_ = auVar13._12_4_ + 1.0;
      auVar26._16_4_ = 0x3f800000;
      auVar26._20_4_ = 0x3f800000;
      auVar26._24_4_ = 0x3f800000;
      auVar26._28_4_ = 0x3f800000;
      auVar49 = vfmadd213ps_fma(auVar16,auVar26,auVar44);
      auVar16 = vrcpps_avx(ZEXT1632(auVar49));
      auVar49 = vfmsub213ps_fma(ZEXT1632(auVar49),auVar16,auVar44);
      auVar49 = vfnmadd132ps_fma(ZEXT1632(auVar49),auVar16,auVar16);
      auVar49 = vfnmsub213ps_fma(ZEXT1632(auVar49),auVar38,auVar44);
      in_ZMM0 = ZEXT1664(auVar49);
      *pauVar6 = ZEXT1632(auVar49);
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar13._0_4_ = *(float *)*pauVar6 * -2.0;
      auVar13._4_4_ = *(float *)((long)*pauVar6 + 4) * -2.0;
      auVar13._8_4_ = *(float *)((long)*pauVar6 + 8) * -2.0;
      auVar13._12_4_ = *(float *)((long)*pauVar6 + 0xc) * -2.0;
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar12 = vminps_avx(auVar13,auVar19);
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar12,auVar20);
      auVar21._8_4_ = 0x3fb8aa3b;
      auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar21._12_4_ = 0x3fb8aa3b;
      auVar37._8_4_ = 0x3f000000;
      auVar37._0_8_ = 0x3f0000003f000000;
      auVar37._12_4_ = 0x3f000000;
      auVar12 = vfmadd213ps_fma(auVar21,auVar18,auVar37);
      auVar27._0_4_ = (int)auVar12._0_4_;
      auVar27._4_4_ = (int)auVar12._4_4_;
      auVar27._8_4_ = (int)auVar12._8_4_;
      auVar27._12_4_ = (int)auVar12._12_4_;
      auVar13 = vcvtdq2ps_avx(auVar27);
      auVar12 = vcmpps_avx(auVar12,auVar13,1);
      auVar12 = vandps_avx(auVar49,auVar12);
      auVar12 = vsubps_avx(auVar13,auVar12);
      auVar28._8_4_ = 0x3f318000;
      auVar28._0_8_ = 0x3f3180003f318000;
      auVar28._12_4_ = 0x3f318000;
      auVar13 = vfmsub231ps_fma(auVar18,auVar12,auVar28);
      auVar29._8_4_ = 0x395e8083;
      auVar29._0_8_ = 0x395e8083395e8083;
      auVar29._12_4_ = 0x395e8083;
      auVar18 = vfmsub231ps_fma(auVar13,auVar12,auVar29);
      auVar30._0_4_ = auVar18._0_4_ * auVar18._0_4_;
      auVar30._4_4_ = auVar18._4_4_ * auVar18._4_4_;
      auVar30._8_4_ = auVar18._8_4_ * auVar18._8_4_;
      auVar30._12_4_ = auVar18._12_4_ * auVar18._12_4_;
      auVar34._8_4_ = 0x39506967;
      auVar34._0_8_ = 0x3950696739506967;
      auVar34._12_4_ = 0x39506967;
      auVar39._8_4_ = 0x3ab743ce;
      auVar39._0_8_ = 0x3ab743ce3ab743ce;
      auVar39._12_4_ = 0x3ab743ce;
      auVar13 = vfmadd213ps_fma(auVar34,auVar18,auVar39);
      auVar40._8_4_ = 0x3c088908;
      auVar40._0_8_ = 0x3c0889083c088908;
      auVar40._12_4_ = 0x3c088908;
      auVar13 = vfmadd213ps_fma(auVar13,auVar18,auVar40);
      auVar41._8_4_ = 0x3d2aa9c1;
      auVar41._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar41._12_4_ = 0x3d2aa9c1;
      auVar13 = vfmadd213ps_fma(auVar13,auVar18,auVar41);
      auVar42._8_4_ = 0x3e2aaaaa;
      auVar42._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar42._12_4_ = 0x3e2aaaaa;
      auVar13 = vfmadd213ps_fma(auVar13,auVar18,auVar42);
      auVar13 = vfmadd213ps_fma(auVar13,auVar18,auVar37);
      auVar13 = vfmadd213ps_fma(auVar13,auVar30,auVar18);
      auVar18._0_4_ = auVar50._0_4_ + auVar13._0_4_;
      auVar18._4_4_ = auVar50._4_4_ + auVar13._4_4_;
      auVar18._8_4_ = auVar50._8_4_ + auVar13._8_4_;
      auVar18._12_4_ = auVar50._12_4_ + auVar13._12_4_;
      auVar22._0_4_ = (int)auVar12._0_4_;
      auVar22._4_4_ = (int)auVar12._4_4_;
      auVar22._8_4_ = (int)auVar12._8_4_;
      auVar22._12_4_ = (int)auVar12._12_4_;
      auVar12 = vpslld_avx(auVar22,0x17);
      auVar12 = vpaddd_avx(auVar49,auVar12);
      auVar13 = vfmadd213ps_fma(auVar12,auVar18,auVar49);
      auVar12 = vrcpps_avx(auVar13);
      auVar31._0_4_ = auVar12._0_4_ + auVar12._0_4_;
      auVar31._4_4_ = auVar12._4_4_ + auVar12._4_4_;
      auVar31._8_4_ = auVar12._8_4_ + auVar12._8_4_;
      auVar31._12_4_ = auVar12._12_4_ + auVar12._12_4_;
      auVar35._8_4_ = 0x40000000;
      auVar35._0_8_ = 0x4000000040000000;
      auVar35._12_4_ = 0x40000000;
      auVar13 = vfmsub213ps_fma(auVar13,auVar31,auVar35);
      auVar12 = vfnmadd213ps_fma(auVar13,auVar12,auVar31);
      auVar14._0_4_ = auVar12._0_4_ + -1.0;
      auVar14._4_4_ = auVar12._4_4_ + -1.0;
      auVar14._8_4_ = auVar12._8_4_ + -1.0;
      auVar14._12_4_ = auVar12._12_4_ + -1.0;
      in_ZMM0 = ZEXT1664(auVar14);
      *(undefined1 (*) [16])*pauVar6 = auVar14;
      pauVar6 = (undefined1 (*) [32])((long)*pauVar6 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      in_ZMM0._0_4_ = tanhf(*(float *)((long)pvVar1 + lVar9 * 4 + lVar5));
      in_ZMM0._4_60_ = extraout_var;
      auVar50 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar9 * 4 + lVar5) = in_ZMM0._0_4_;
    }
  }
  return 0;
}

Assistant:

int TanH_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}